

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void writeRaw(FILE *outf,char *groupname,dotNode *(*results) [7],float probeRad,char *label,
             float density,int conFlag)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  atom *src;
  atom *targ;
  char *pcVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  char *local_e0;
  double scaledGap;
  float local_b0;
  float score;
  float d2sc;
  float d2be;
  float ke2be;
  float dtgp;
  float sl;
  float gap;
  char *mast [7];
  atom *t;
  atom *a;
  dotNode *node;
  int j;
  int i;
  int conFlag_local;
  float density_local;
  char *label_local;
  float probeRad_local;
  dotNode *(*results_local) [7];
  char *groupname_local;
  FILE *outf_local;
  
  memcpy(&sl,&PTR_anon_var_dwarf_edea_00154d50,0x38);
  for (node._4_4_ = 0; node._4_4_ < 0x72; node._4_4_ = node._4_4_ + 1) {
    for (node._0_4_ = 0; (int)node < 7; node._0_4_ = (int)node + 1) {
      a = (atom *)results[node._4_4_][(int)node];
      if (a != (atom *)0x0) {
        a = (atom *)Condense((dotNode *)a,conFlag);
        results[node._4_4_][(int)node] = (dotNode *)a;
      }
      for (; a != (atom *)0x0; a = a->next) {
        fprintf((FILE *)outf,"%s:%s:%s:",label,groupname,*(undefined8 *)(&sl + (long)(int)node * 2))
        ;
        src = a->nextInBin;
        targ = a->scratch;
        fprintf((FILE *)outf,"%s%4.4s%c%s %s%c:",src->r->chain,src->r->Hy36resno,
                (ulong)(uint)(int)src->r->resInsCode,src->r->resname,src->atomname,(int)src->altConf
               );
        if (targ == (atom *)0x0) {
          fprintf((FILE *)outf,":::::::");
        }
        else {
          fprintf((FILE *)outf,"%s%4.4s%c%s %s%c:",targ->r->chain,targ->r->Hy36resno,
                  (ulong)(uint)(int)targ->r->resInsCode,targ->r->resname,targ->atomname,
                  (int)targ->altConf);
          fVar5 = gapSize(&src->loc,&targ->loc,src->radius + targ->radius);
          fVar1 = *(float *)((long)&(a->loc).z + 4);
          if (OldStyleU != 0) {
            d2sc = kissEdge2bullsEye(src->radius,targ->radius,probeRad);
            score = dot2bullsEye((point3d *)&a->bondedto,src,targ);
            local_b0 = dot2srcCenter((point3d *)&a->bondedto,src,targ);
          }
          fVar6 = gapSize((point3d *)&a->bondedto,(point3d *)&a->atomclass,0.0);
          scaledGap._4_4_ = 0.0;
          switch((int)node) {
          case 0:
          case 1:
            dVar7 = exp(-(double)(fVar1 / GAPweight) * (double)(fVar1 / GAPweight));
            scaledGap._4_4_ = (float)dVar7;
            break;
          case 2:
          case 3:
          case 4:
            scaledGap._4_4_ = -BUMPweight * fVar6;
            break;
          case 5:
            scaledGap._4_4_ = -BUMPweight * fVar6;
            break;
          case 6:
            scaledGap._4_4_ = HBweight * fVar6;
          }
          if (conFlag == 0) {
            if (LOneDotEach != 0) {
              fprintf((FILE *)outf,"%.2f:",(double)(float)a->iz);
            }
          }
          else {
            fprintf((FILE *)outf,"%i:",(ulong)(uint)a->iy);
          }
          if (OldStyleU == 0) {
            fprintf((FILE *)outf,"%.3f:%.3f:%.3f:%.3f:%.3f:%.3f:%.4f",(double)fVar5,(double)fVar1,
                    *(undefined8 *)&a->atomclass,(a->loc).x,(a->loc).y,(double)fVar6,
                    (double)(scaledGap._4_4_ / density));
          }
          else {
            fprintf((FILE *)outf,"%.3f:%.3f:%.3f:%.3f:%.3f:%.3f:%.4f",(double)fVar5,(double)fVar1,
                    (double)d2sc,(double)score,(double)local_b0,(double)fVar6,
                    (double)(scaledGap._4_4_ / density));
          }
        }
        pcVar4 = getAtomName(node._4_4_);
        if (targ == (atom *)0x0) {
          local_e0 = "";
        }
        else {
          local_e0 = getAtomName(targ->atomclass);
        }
        uVar2._0_4_ = a->mark;
        uVar2._4_4_ = a->flags;
        uVar3._0_4_ = a->props;
        uVar3._4_4_ = a->elem;
        fprintf((FILE *)outf,":%s:%s:%.3f:%.3f:%.3f",a->bondedto,uVar2,uVar3,pcVar4,local_e0);
        if (targ == (atom *)0x0) {
          fprintf((FILE *)outf,":%.2f:\n",(double)src->bval);
        }
        else {
          fprintf((FILE *)outf,":%.2f:%.2f\n",(double)src->bval,(double)targ->bval);
        }
      }
    }
  }
  return;
}

Assistant:

void writeRaw(FILE *outf, char* groupname, dotNode *results[][NODEWIDTH],
	       float probeRad, char* label, float density, int conFlag) //conFlag added SJ 10/07/2011
{
   int i, j;
   dotNode *node;
   atom *a, *t;
  // char *mast[NODEWIDTH] = {"wc", "cc", "so", "bo", "hb"};
   char *mast[NODEWIDTH] = {"wc","cc","wh","so","bo","wo","hb"}; /* 04/10/2015 SJ to changed to match new categories of weak H bonds and worse overlap (these lists are made only if LweakHbonds and LworseOverlap are true respectively). see NODEWIDTH probe.h*/
   
   float gap, sl, dtgp, ke2be, d2be, d2sc, score;
   double scaledGap;
   for (i = 0; i < NUMATOMTYPES; i++)
   {/*loop over NUMATOMTYPES*/

      for (j = 0; j < NODEWIDTH; j++)
      {/*loop over NODEWIDTH*/

         node = results[i][j];
         if(node) // added 10/05/11 - SJ for condensing rawOutput
         {
             node = Condense(node,conFlag);
             results[i][j]=node;
         }
         while(node)
         {/*while node...*/
             fprintf(outf, "%s:%s:%s:", label, groupname, mast[j]);
             a = node->a;
             t = node->t;
             
             fprintf(outf, "%s%4.4s%c%s %s%c:",
                     a->r->chain, a->r->Hy36resno, a->r->resInsCode,
                     a->r->resname,a->atomname, a->altConf);
             
             if(t)
             {/*t node exists*/
                 fprintf(outf, "%s%4.4s%c%s %s%c:",
                         t->r->chain, t->r->Hy36resno, t->r->resInsCode,
                         t->r->resname,t->atomname, t->altConf);
                 gap = gapSize(&(a->loc), &(t->loc),(a->radius + t->radius));
                 dtgp = node->gap;
                 if (OldStyleU)
                 {
                     ke2be = kissEdge2bullsEye(a->radius, t->radius, probeRad);
                     d2be = dot2bullsEye(&(node->loc), a, t);
                     d2sc = dot2srcCenter(&(node->loc), a, t);
                 }
                 sl = gapSize(&(node->loc), &(node->spike), 0.0);
                 score = 0.0;
                 switch(j) /* SJ 04/10/2015 changed to include new categories*/
                 {
                    case 0:
                    case 1:
                           scaledGap = dtgp/GAPweight;
                           score = exp(-scaledGap*scaledGap);
                           break;
                    case 2: /* TODO: SJ weak H bonds, don't know what to do here, because they can be both wc and cc, so will have to check*/
                    case 3: /* small overlap, doing nothing, as before*/
                    case 4: score = -BUMPweight * sl; break;
                    case 5: score = -BUMPweight * sl; break; /* worse overlap, same as bad overlap*/
                    case 6: score =    HBweight * sl; break;
                 }
                 if(conFlag)
                 {
                      fprintf(outf,"%i:",node->dotCount);
                 }
                 else if(LOneDotEach)  /*dcr20120120*/
                 {
                      fprintf(outf,"%.2f:",node->angle);
                 }
                 if (OldStyleU)
                 {
                     fprintf(outf, "%.3f:%.3f:%.3f:%.3f:%.3f:%.3f:%.4f",
                             gap, dtgp, ke2be, d2be, d2sc, sl, score/density);
                 }
                 else
                 {
                     fprintf(outf, "%.3f:%.3f:%.3f:%.3f:%.3f:%.3f:%.4f",
                             gap, dtgp, node->spike.x, node->spike.y,
                             node->spike.z, sl, score/density);
                 }
             }/*t node exists*/
             else
             {
                 fprintf(outf, ":::::::");
             }

             fprintf(outf,":%s:%s:%.3f:%.3f:%.3f",
                         getAtomName(i),(t?getAtomName(t->atomclass):""),
                         node->loc.x,node->loc.y,node->loc.z);

             if(t)
             {
                 fprintf(outf, ":%.2f:%.2f\n", a->bval, t->bval);
             }
             else
             {
                 fprintf(outf, ":%.2f:\n", a->bval);
             }
             node = node->next;
         }/*while node...*/
      }/*loop over NODEWIDTH*/
   }/*loop over NUMATOMTYPES*/
}